

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::texSubImage3D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int yoffset,int zoffset,
          int width,int height,int depth,deUint32 format,deUint32 type,void *data)

{
  long lVar1;
  DataBuffer *pDVar2;
  pointer puVar3;
  CubeFace CVar4;
  Texture1D *pTVar5;
  pointer puVar6;
  pointer pTVar7;
  Texture1D *pTVar8;
  TextureCube *pTVar9;
  PixelBufferAccess dst;
  ConstPixelBufferAccess src;
  PixelBufferAccess local_60;
  TextureFormat transferFmt;
  
  if (((yoffset | xoffset | zoffset) < 0) || ((height | width | depth) < 0)) goto LAB_008859e3;
  pTVar7 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  transferFmt = glu::mapGLTransferFormat(format,type);
  if (transferFmt.order == CHANNELORDER_LAST || transferFmt.type == CHANNELTYPE_LAST) {
LAB_0088584c:
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  pDVar2 = this->m_pixelUnpackBufferBinding;
  if (pDVar2 != (DataBuffer *)0x0) {
    puVar3 = (pDVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pointer)0x0;
    if (puVar3 != (pDVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      puVar6 = puVar3;
    }
    data = (void *)((long)data + (long)puVar6);
  }
  getUnpack3DAccess(&src,this,&transferFmt,width,height,depth,data);
  if (target == 0xde1) {
    pTVar5 = (Texture1D *)pTVar7->tex2DBinding;
    pTVar8 = (Texture1D *)&pTVar7->default2DTex;
LAB_008858f9:
    if (pTVar5 != (Texture1D *)0x0) {
      pTVar8 = pTVar5;
    }
    if ((0xd < (uint)level) || (*(long *)((long)((pTVar8->m_levels).m_data + (uint)level) + 8) == 0)
       ) goto LAB_008859e3;
    lVar1 = (long)(pTVar8->m_levels).m_data + (ulong)(uint)level * 0x28 + -0x60;
  }
  else {
    if (target == 0xde0) {
      if (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) != 0x100) goto LAB_0088584c;
      pTVar5 = pTVar7->tex1DBinding;
      pTVar8 = &pTVar7->default1DTex;
      goto LAB_008858f9;
    }
    if (5 < target - 0x8515) {
      if (target == 0x9009) {
        pTVar5 = (Texture1D *)pTVar7->texCubeArrayBinding;
        pTVar8 = (Texture1D *)&pTVar7->defaultCubeArrayTex;
      }
      else if (target == 0x8c1a) {
        pTVar5 = (Texture1D *)pTVar7->tex2DArrayBinding;
        pTVar8 = (Texture1D *)&pTVar7->default2DArrayTex;
      }
      else {
        if (target != 0x806f) goto LAB_0088584c;
        pTVar5 = (Texture1D *)pTVar7->tex3DBinding;
        pTVar8 = (Texture1D *)&pTVar7->default3DTex;
      }
      goto LAB_008858f9;
    }
    if (0xd < (uint)level) goto LAB_008859e3;
    CVar4 = mapGLCubeFace(target);
    pTVar9 = &pTVar7->defaultCubeTex;
    if (pTVar7->texCubeBinding != (TextureCube *)0x0) {
      pTVar9 = pTVar7->texCubeBinding;
    }
    if (*(long *)((long)(pTVar9->m_levels[CVar4].m_data + (uint)level) + 8) == 0) goto LAB_008859e3;
    lVar1 = (long)pTVar9->m_levels[CVar4].m_data + (ulong)(uint)level * 0x28 + -0x60;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&dst.super_ConstPixelBufferAccess,(ConstPixelBufferAccess *)(lVar1 + 0x140));
  if (((width + xoffset <= dst.super_ConstPixelBufferAccess.m_size.m_data[0]) &&
      (height + yoffset <= dst.super_ConstPixelBufferAccess.m_size.m_data[1])) &&
     (depth + zoffset <= dst.super_ConstPixelBufferAccess.m_size.m_data[2])) {
    if ((dst.super_ConstPixelBufferAccess.m_format.order != DS) &&
       (dst.super_ConstPixelBufferAccess.m_format.order != D)) {
      tcu::getSubregion(&local_60,&dst,xoffset,yoffset,zoffset,width,height,depth);
      tcu::copy((EVP_PKEY_CTX *)&local_60,(EVP_PKEY_CTX *)&src);
      return;
    }
    tcu::getSubregion(&local_60,&dst,xoffset,yoffset,zoffset,width,height,depth);
    depthValueFloatClampCopy(&local_60,&src);
    return;
  }
LAB_008859e3:
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texSubImage3D (deUint32 target, int level, int xoffset, int yoffset, int zoffset, int width, int height, int depth, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit& unit = m_textureUnits[m_activeTexture];

	RC_IF_ERROR(xoffset < 0 || yoffset < 0 || zoffset < 0,	GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0,		GL_INVALID_VALUE, RC_RET_VOID);

	TextureFormat transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	ConstPixelBufferAccess src = getUnpack3DAccess(transferFmt, width, height, depth, getPixelUnpackPtr(data));

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		Texture1D& texture = unit.tex1DBinding ? *unit.tex1DBinding : unit.default1DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		TextureCube&	texture		= unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;
		tcu::CubeFace	face		= mapGLCubeFace(target);

		RC_IF_ERROR(!texture.hasFace(level, face), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getFace(level, face);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_3D)
	{
		Texture3D& texture = unit.tex3DBinding ? *unit.tex3DBinding : unit.default3DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		Texture2DArray& texture = unit.tex2DArrayBinding ? *unit.tex2DArrayBinding : unit.default2DArrayTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		TextureCubeArray& texture = unit.texCubeArrayBinding ? *unit.texCubeArrayBinding : unit.defaultCubeArrayTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}